

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

void objectContentToJson(QCborContainerPrivate *o,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  bool bVar2;
  QString *pQVar3;
  byte in_CL;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QByteArray indentString;
  QCborValue e;
  undefined7 in_stack_fffffffffffffee8;
  char in_stack_fffffffffffffeef;
  QCborValue *in_stack_fffffffffffffef0;
  QString *in_stack_fffffffffffffef8;
  QStringView *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int iVar4;
  undefined4 in_stack_ffffffffffffff0c;
  qsizetype in_stack_ffffffffffffff10;
  QByteArray *in_stack_ffffffffffffff18;
  QString *pQVar5;
  undefined1 in_stack_ffffffffffffff43;
  int in_stack_ffffffffffffff44;
  QByteArray *in_stack_ffffffffffffff48;
  QCborValue *in_stack_ffffffffffffff50;
  QStringView in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI != 0) &&
     (bVar2 = QList<QtCbor::Element>::empty((QList<QtCbor::Element> *)0x4a41a4), !bVar2)) {
    QByteArray::QByteArray
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (char)((uint)in_stack_ffffffffffffff0c >> 0x18));
    pQVar5 = (QString *)0x0;
    while( true ) {
      QCborContainerPrivate::valueAt
                ((QCborContainerPrivate *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (qsizetype)in_stack_ffffffffffffff00);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffef0,
                 (QByteArray *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
      QCborContainerPrivate::valueAt
                ((QCborContainerPrivate *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (qsizetype)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff00 = (QStringView *)&stack0xffffffffffffff38;
      QString::QString((QString *)0x4a428a);
      QCborValue::toString
                ((QCborValue *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (QString *)in_stack_ffffffffffffff00);
      QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      escapedString(in_stack_ffffffffffffffb0);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffef0,
                 (QByteArray *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      QByteArray::~QByteArray((QByteArray *)0x4a42f5);
      QString::~QString((QString *)0x4a42ff);
      QString::~QString((QString *)0x4a4309);
      QCborValue::~QCborValue(in_stack_fffffffffffffef0);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffef0,
                 (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      QCborContainerPrivate::valueAt
                ((QCborContainerPrivate *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (qsizetype)in_stack_ffffffffffffff00);
      valueContentToJson(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff44,(bool)in_stack_ffffffffffffff43);
      QCborValue::~QCborValue(in_stack_fffffffffffffef0);
      in_stack_fffffffffffffef8 = (QString *)((long)&(pQVar5->d).d + 2);
      pQVar5 = in_stack_fffffffffffffef8;
      pQVar3 = (QString *)QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RDI + 0x28));
      if (in_stack_fffffffffffffef8 == pQVar3) {
        if ((in_CL & 1) == 0) {
          QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
        }
        iVar4 = 3;
      }
      else {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffef0,
                   (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
        iVar4 = 0;
      }
      QCborValue::~QCborValue(in_stack_fffffffffffffef0);
      if (iVar4 != 0) break;
      in_stack_ffffffffffffff08 = 0;
    }
    QByteArray::~QByteArray((QByteArray *)0x4a4501);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void objectContentToJson(const QCborContainerPrivate *o, QByteArray &json, int indent, bool compact)
{
    if (!o || o->elements.empty())
        return;

    QByteArray indentString(4*indent, ' ');

    qsizetype i = 0;
    while (true) {
        QCborValue e = o->valueAt(i);
        json += indentString;
        json += '"';
        json += escapedString(o->valueAt(i).toString());
        json += compact ? "\":" : "\": ";
        valueContentToJson(o->valueAt(i + 1), json, indent, compact);

        if ((i += 2) == o->elements.size()) {
            if (!compact)
                json += '\n';
            break;
        }

        json += compact ? "," : ",\n";
    }
}